

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON * cJSON_DetachItemFromArray(cJSON *array,int which)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  bool bVar3;
  cJSON *pcVar4;
  cJSON **ppcVar5;
  
  ppcVar5 = &array->child;
  pcVar4 = (cJSON *)ppcVar5;
  do {
    pcVar4 = pcVar4->next;
    if (pcVar4 == (cJSON *)0x0) break;
    bVar3 = 0 < which;
    which = which + -1;
  } while (bVar3);
  if (pcVar4 != (cJSON *)0x0) {
    pcVar1 = pcVar4->prev;
    if (pcVar1 != (cJSON *)0x0) {
      pcVar1->next = pcVar4->next;
    }
    pcVar2 = pcVar4->next;
    if (pcVar2 != (cJSON *)0x0) {
      pcVar2->prev = pcVar1;
    }
    if (pcVar4 == *ppcVar5) {
      *ppcVar5 = pcVar2;
    }
    pcVar4->next = (cJSON *)0x0;
    pcVar4->prev = (cJSON *)0x0;
    return pcVar4;
  }
  return (cJSON *)0x0;
}

Assistant:

cJSON *
cJSON_DetachItemFromArray(cJSON *array, int which)
{
    cJSON *c = array->child;
    while (c && which > 0)
        c = c->next, which--;
    if (!c)
        return 0;
    if (c->prev)
        c->prev->next = c->next;
    if (c->next)
        c->next->prev = c->prev;
    if (c == array->child)
        array->child = c->next;
    c->prev = c->next = 0;
    return c;
}